

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int x509_crt_verify_child
              (mbedtls_x509_crt *child,mbedtls_x509_crt *parent,mbedtls_x509_crt *trust_ca,
              mbedtls_x509_crl *ca_crl,mbedtls_x509_crt_profile *profile,int path_cnt,int self_cnt,
              uint32_t *flags,_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *f_vrfy,
              void *p_vrfy)

{
  mbedtls_pk_type_t type;
  void *options;
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  mbedtls_md_info_t *md_info;
  mbedtls_x509_crt *pmVar6;
  ulong uVar7;
  uint32_t parent_flags;
  mbedtls_x509_crt_profile *local_a8;
  ulong local_a0;
  mbedtls_x509_crl *local_98;
  ulong local_90;
  mbedtls_x509_crt *local_88;
  mbedtls_md_type_t local_7c;
  uchar hash [64];
  
  parent_flags = 0;
  local_98 = ca_crl;
  local_88 = trust_ca;
  if (path_cnt == 0) {
    iVar2 = 1;
  }
  else {
    iVar2 = x509_name_cmp(&child->issuer,&child->subject);
    self_cnt = self_cnt + (uint)(iVar2 == 0);
    if (7 < path_cnt) {
      iVar2 = -0x2700;
      parent_flags = 8;
      goto LAB_00122fa9;
    }
    iVar2 = path_cnt + 1;
  }
  iVar3 = mbedtls_x509_time_is_past(&child->valid_to);
  if (iVar3 != 0) {
    *(byte *)flags = (byte)*flags | 1;
  }
  iVar3 = mbedtls_x509_time_is_future(&child->valid_from);
  if (iVar3 != 0) {
    *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 2;
  }
  if ((profile->allowed_mds >> ((byte)((char)child->sig_md - MBEDTLS_MD_MD2) & 0x1f) & 1) == 0) {
    *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 0x40;
  }
  if ((profile->allowed_pks >> ((byte)((char)child->sig_pk - MBEDTLS_PK_RSA) & 0x1f) & 1) == 0) {
    *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 0x80;
  }
  local_a8 = profile;
  local_a0 = (ulong)(uint)self_cnt;
  md_info = mbedtls_md_info_from_type(child->sig_md);
  local_90 = (ulong)(uint)path_cnt;
  if (md_info == (mbedtls_md_info_t *)0x0) {
LAB_00122e1f:
    *(byte *)flags = (byte)*flags | 8;
  }
  else {
    mbedtls_md(md_info,(child->tbs).p,(child->tbs).len,hash);
    iVar3 = x509_profile_check_key(local_a8,child->sig_pk,&parent->pk);
    if (iVar3 != 0) {
      *(byte *)((long)flags + 2) = *(byte *)((long)flags + 2) | 1;
    }
    local_7c = child->sig_md;
    type = child->sig_pk;
    options = child->sig_opts;
    bVar1 = mbedtls_md_get_size(md_info);
    iVar3 = mbedtls_pk_verify_ext
                      (type,options,&parent->pk,local_7c,hash,(ulong)bVar1,(child->sig).p,
                       (child->sig).len);
    if (iVar3 != 0) goto LAB_00122e1f;
  }
  uVar7 = local_90;
  iVar3 = (int)local_90;
  uVar4 = x509_crt_verifycrl(child,parent,local_98,local_a8);
  *flags = *flags | uVar4;
  for (pmVar6 = local_88; uVar4 = (uint)(iVar3 == 0), pmVar6 != (mbedtls_x509_crt *)0x0;
      pmVar6 = pmVar6->next) {
    iVar5 = x509_crt_check_parent(parent,pmVar6,0,uVar4);
    if (iVar5 == 0) {
      iVar2 = x509_crt_verify_top(parent,pmVar6,local_98,local_a8,iVar2,(int)local_a0,&parent_flags,
                                  f_vrfy,p_vrfy);
      if (iVar2 != 0) {
        return iVar2;
      }
      goto LAB_00122f8c;
    }
  }
  iVar3 = iVar3 - (int)local_a0;
  pmVar6 = parent;
  do {
    pmVar6 = pmVar6->next;
    if (pmVar6 == (mbedtls_x509_crt *)0x0) {
      iVar2 = x509_crt_verify_top(parent,local_88,local_98,local_a8,iVar2,(int)local_a0,
                                  &parent_flags,f_vrfy,p_vrfy);
      goto LAB_00122f7c;
    }
  } while (((0 < pmVar6->max_pathlen) && (pmVar6->max_pathlen < iVar3 + 2)) ||
          (iVar5 = x509_crt_check_parent(parent,pmVar6,0,uVar4), iVar5 != 0));
  iVar2 = x509_crt_verify_child
                    (parent,pmVar6,local_88,local_98,local_a8,iVar2,(int)local_a0,&parent_flags,
                     f_vrfy,p_vrfy);
LAB_00122f7c:
  uVar7 = local_90;
  if (iVar2 != 0) {
    return iVar2;
  }
LAB_00122f8c:
  if ((f_vrfy != (_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *)0x0) &&
     (iVar2 = (*f_vrfy)(p_vrfy,child,(int)uVar7,flags), iVar2 != 0)) {
    return iVar2;
  }
  iVar2 = 0;
LAB_00122fa9:
  *flags = *flags | parent_flags;
  return iVar2;
}

Assistant:

static int x509_crt_verify_child(
                mbedtls_x509_crt *child, mbedtls_x509_crt *parent,
                mbedtls_x509_crt *trust_ca, mbedtls_x509_crl *ca_crl,
                const mbedtls_x509_crt_profile *profile,
                int path_cnt, int self_cnt, uint32_t *flags,
                int (*f_vrfy)(void *, mbedtls_x509_crt *, int, uint32_t *),
                void *p_vrfy )
{
    int ret;
    uint32_t parent_flags = 0;
    unsigned char hash[MBEDTLS_MD_MAX_SIZE];
    mbedtls_x509_crt *grandparent;
    const mbedtls_md_info_t *md_info;

    /* Counting intermediate self signed certificates */
    if( ( path_cnt != 0 ) && x509_name_cmp( &child->issuer, &child->subject ) == 0 )
        self_cnt++;

    /* path_cnt is 0 for the first intermediate CA */
    if( 1 + path_cnt > MBEDTLS_X509_MAX_INTERMEDIATE_CA )
    {
        *flags |= MBEDTLS_X509_BADCERT_NOT_TRUSTED;
        return( MBEDTLS_ERR_X509_CERT_VERIFY_FAILED );
    }

    if( mbedtls_x509_time_is_past( &child->valid_to ) )
        *flags |= MBEDTLS_X509_BADCERT_EXPIRED;

    if( mbedtls_x509_time_is_future( &child->valid_from ) )
        *flags |= MBEDTLS_X509_BADCERT_FUTURE;

    if( x509_profile_check_md_alg( profile, child->sig_md ) != 0 )
        *flags |= MBEDTLS_X509_BADCERT_BAD_MD;

    if( x509_profile_check_pk_alg( profile, child->sig_pk ) != 0 )
        *flags |= MBEDTLS_X509_BADCERT_BAD_PK;

    md_info = mbedtls_md_info_from_type( child->sig_md );
    if( md_info == NULL )
    {
        /*
         * Cannot check 'unknown' hash
         */
        *flags |= MBEDTLS_X509_BADCERT_NOT_TRUSTED;
    }
    else
    {
        mbedtls_md( md_info, child->tbs.p, child->tbs.len, hash );

        if( x509_profile_check_key( profile, child->sig_pk, &parent->pk ) != 0 )
            *flags |= MBEDTLS_X509_BADCERT_BAD_KEY;

        if( mbedtls_pk_verify_ext( child->sig_pk, child->sig_opts, &parent->pk,
                           child->sig_md, hash, mbedtls_md_get_size( md_info ),
                           child->sig.p, child->sig.len ) != 0 )
        {
            *flags |= MBEDTLS_X509_BADCERT_NOT_TRUSTED;
        }
    }

#if defined(MBEDTLS_X509_CRL_PARSE_C)
    /* Check trusted CA's CRL for the given crt */
    *flags |= x509_crt_verifycrl(child, parent, ca_crl, profile );
#endif

    /* Look for a grandparent in trusted CAs */
    for( grandparent = trust_ca;
         grandparent != NULL;
         grandparent = grandparent->next )
    {
        if( x509_crt_check_parent( parent, grandparent,
                                   0, path_cnt == 0 ) == 0 )
            break;
    }

    if( grandparent != NULL )
    {
        ret = x509_crt_verify_top( parent, grandparent, ca_crl, profile,
                                path_cnt + 1, self_cnt, &parent_flags, f_vrfy, p_vrfy );
        if( ret != 0 )
            return( ret );
    }
    else
    {
        /* Look for a grandparent upwards the chain */
        for( grandparent = parent->next;
             grandparent != NULL;
             grandparent = grandparent->next )
        {
            /* +2 because the current step is not yet accounted for
             * and because max_pathlen is one higher than it should be.
             * Also self signed certificates do not count to the limit. */
            if( grandparent->max_pathlen > 0 &&
                grandparent->max_pathlen < 2 + path_cnt - self_cnt )
            {
                continue;
            }

            if( x509_crt_check_parent( parent, grandparent,
                                       0, path_cnt == 0 ) == 0 )
                break;
        }

        /* Is our parent part of the chain or at the top? */
        if( grandparent != NULL )
        {
            ret = x509_crt_verify_child( parent, grandparent, trust_ca, ca_crl,
                                         profile, path_cnt + 1, self_cnt, &parent_flags,
                                         f_vrfy, p_vrfy );
            if( ret != 0 )
                return( ret );
        }
        else
        {
            ret = x509_crt_verify_top( parent, trust_ca, ca_crl, profile,
                                       path_cnt + 1, self_cnt, &parent_flags,
                                       f_vrfy, p_vrfy );
            if( ret != 0 )
                return( ret );
        }
    }

    /* child is verified to be a child of the parent, call verify callback */
    if( NULL != f_vrfy )
        if( ( ret = f_vrfy( p_vrfy, child, path_cnt, flags ) ) != 0 )
            return( ret );

    *flags |= parent_flags;

    return( 0 );
}